

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O0

void __thiscall Fl_Scroll::recalc_scrollbars(Fl_Scroll *this,ScrollInfo *si)

{
  Fl_Widget *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  int iVar5;
  Fl_Align FVar6;
  Fl_Widget **ppFVar7;
  int local_84;
  int local_80;
  int local_7c;
  int local_48;
  int local_44;
  int H;
  int W;
  int Y;
  int X;
  Fl_Widget *o;
  Fl_Widget **ppFStack_28;
  int i;
  Fl_Widget **a;
  int first;
  ScrollInfo *si_local;
  Fl_Scroll *this_local;
  
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dx(FVar4);
  (si->innerbox).x = iVar3 + iVar5;
  iVar3 = Fl_Widget::y((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dy(FVar4);
  (si->innerbox).y = iVar3 + iVar5;
  iVar3 = Fl_Widget::w((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dw(FVar4);
  (si->innerbox).w = iVar3 - iVar5;
  iVar3 = Fl_Widget::h((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dh(FVar4);
  (si->innerbox).h = iVar3 - iVar5;
  (si->child).l = (si->innerbox).x;
  (si->child).r = (si->innerbox).x;
  (si->child).b = (si->innerbox).y;
  (si->child).t = (si->innerbox).y;
  bVar1 = true;
  ppFStack_28 = Fl_Group::array(&this->super_Fl_Group);
  o._4_4_ = Fl_Group::children(&this->super_Fl_Group);
  while (iVar3 = o._4_4_ + -1, o._4_4_ != 0) {
    ppFVar7 = ppFStack_28 + 1;
    this_00 = *ppFStack_28;
    o._4_4_ = iVar3;
    ppFStack_28 = ppFVar7;
    if (((Fl_Scrollbar *)this_00 != &this->scrollbar) &&
       ((Fl_Scrollbar *)this_00 != &this->hscrollbar)) {
      if (bVar1) {
        bVar1 = false;
        iVar3 = Fl_Widget::x(this_00);
        (si->child).l = iVar3;
        iVar3 = Fl_Widget::x(this_00);
        iVar5 = Fl_Widget::w(this_00);
        (si->child).r = iVar3 + iVar5;
        iVar3 = Fl_Widget::y(this_00);
        iVar5 = Fl_Widget::h(this_00);
        (si->child).b = iVar3 + iVar5;
        iVar3 = Fl_Widget::y(this_00);
        (si->child).t = iVar3;
      }
      else {
        iVar3 = Fl_Widget::x(this_00);
        if (iVar3 < (si->child).l) {
          iVar3 = Fl_Widget::x(this_00);
          (si->child).l = iVar3;
        }
        iVar3 = Fl_Widget::y(this_00);
        if (iVar3 < (si->child).t) {
          iVar3 = Fl_Widget::y(this_00);
          (si->child).t = iVar3;
        }
        iVar3 = Fl_Widget::x(this_00);
        iVar5 = Fl_Widget::w(this_00);
        if ((si->child).r < iVar3 + iVar5) {
          iVar3 = Fl_Widget::x(this_00);
          iVar5 = Fl_Widget::w(this_00);
          (si->child).r = iVar3 + iVar5;
        }
        iVar3 = Fl_Widget::y(this_00);
        iVar5 = Fl_Widget::h(this_00);
        if ((si->child).b < iVar3 + iVar5) {
          iVar3 = Fl_Widget::y(this_00);
          iVar5 = Fl_Widget::h(this_00);
          (si->child).b = iVar3 + iVar5;
        }
      }
    }
  }
  W = (si->innerbox).x;
  H = (si->innerbox).y;
  local_44 = (si->innerbox).w;
  local_48 = (si->innerbox).h;
  if (this->scrollbar_size_ == 0) {
    local_7c = Fl::scrollbar_size();
  }
  else {
    local_7c = this->scrollbar_size_;
  }
  si->scrollsize = local_7c;
  si->vneeded = 0;
  si->hneeded = 0;
  bVar2 = Fl_Widget::type((Fl_Widget *)this);
  if (((bVar2 & 2) != 0) &&
     (((bVar2 = Fl_Widget::type((Fl_Widget *)this), (bVar2 & 4) != 0 || ((si->child).t < H)) ||
      (H + local_48 < (si->child).b)))) {
    si->vneeded = 1;
    local_44 = local_44 - si->scrollsize;
    FVar6 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar6 & 4) != 0) {
      W = si->scrollsize + W;
    }
  }
  bVar2 = Fl_Widget::type((Fl_Widget *)this);
  if (((bVar2 & 1) != 0) &&
     (((bVar2 = Fl_Widget::type((Fl_Widget *)this), (bVar2 & 4) != 0 || ((si->child).l < W)) ||
      (W + local_44 < (si->child).r)))) {
    si->hneeded = 1;
    local_48 = local_48 - si->scrollsize;
    FVar6 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar6 & 1) != 0) {
      H = si->scrollsize + H;
    }
    if (((si->vneeded == 0) && (bVar2 = Fl_Widget::type((Fl_Widget *)this), (bVar2 & 2) != 0)) &&
       ((bVar2 = Fl_Widget::type((Fl_Widget *)this), (bVar2 & 4) != 0 ||
        (((si->child).t < H || (H + local_48 < (si->child).b)))))) {
      si->vneeded = 1;
      local_44 = local_44 - si->scrollsize;
      FVar6 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
      if ((FVar6 & 4) != 0) {
        W = si->scrollsize + W;
      }
    }
  }
  (si->innerchild).x = W;
  (si->innerchild).y = H;
  (si->innerchild).w = local_44;
  (si->innerchild).h = local_48;
  (si->hscroll).x = (si->innerchild).x;
  FVar6 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
  if ((FVar6 & 1) == 0) {
    local_80 = ((si->innerbox).y + (si->innerbox).h) - si->scrollsize;
  }
  else {
    local_80 = (si->innerbox).y;
  }
  (si->hscroll).y = local_80;
  (si->hscroll).w = (si->innerchild).w;
  (si->hscroll).h = si->scrollsize;
  FVar6 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
  if ((FVar6 & 4) == 0) {
    local_84 = ((si->innerbox).x + (si->innerbox).w) - si->scrollsize;
  }
  else {
    local_84 = (si->innerbox).x;
  }
  (si->vscroll).x = local_84;
  (si->vscroll).y = (si->innerchild).y;
  (si->vscroll).w = si->scrollsize;
  (si->vscroll).h = (si->innerchild).h;
  (si->hscroll).pos = (si->innerchild).x - (si->child).l;
  (si->hscroll).size = (si->innerchild).w;
  (si->hscroll).first = 0;
  (si->hscroll).total = (si->child).r - (si->child).l;
  if ((si->hscroll).pos < 0) {
    (si->hscroll).total = (si->hscroll).total - (si->hscroll).pos;
    (si->hscroll).first = (si->hscroll).pos;
  }
  (si->vscroll).pos = (si->innerchild).y - (si->child).t;
  (si->vscroll).size = (si->innerchild).h;
  (si->vscroll).first = 0;
  (si->vscroll).total = (si->child).b - (si->child).t;
  if ((si->vscroll).pos < 0) {
    (si->vscroll).total = (si->vscroll).total - (si->vscroll).pos;
    (si->vscroll).first = (si->vscroll).pos;
  }
  return;
}

Assistant:

void Fl_Scroll::recalc_scrollbars(ScrollInfo &si) {

  // inner box of widget (excluding scrollbars)
  si.innerbox.x = x()+Fl::box_dx(box());
  si.innerbox.y = y()+Fl::box_dy(box());
  si.innerbox.w = w()-Fl::box_dw(box());
  si.innerbox.h = h()-Fl::box_dh(box());

  // accumulate a bounding box for all the children
  si.child.l = si.innerbox.x;
  si.child.r = si.innerbox.x;
  si.child.b = si.innerbox.y;
  si.child.t = si.innerbox.y;
  int first = 1;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if ( o==&scrollbar || o==&hscrollbar ) continue;
    if ( first ) {
        first = 0;
	si.child.l = o->x();
	si.child.r = o->x()+o->w();
	si.child.b = o->y()+o->h();
	si.child.t = o->y();
    } else {
	if (o->x() < si.child.l) si.child.l = o->x();
	if (o->y() < si.child.t) si.child.t = o->y();
	if (o->x()+o->w() > si.child.r) si.child.r = o->x()+o->w();
	if (o->y()+o->h() > si.child.b) si.child.b = o->y()+o->h();
    }
  }

  // Turn the scrollbars on and off as necessary.
  // See if children would fit if we had no scrollbars...
  {
    int X = si.innerbox.x;
    int Y = si.innerbox.y;
    int W = si.innerbox.w;
    int H = si.innerbox.h;

    si.scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    si.vneeded = 0;
    si.hneeded = 0;
    if (type() & VERTICAL) {
      if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	si.vneeded = 1;
	W -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
      }
    }
    if (type() & HORIZONTAL) {
      if ((type() & ALWAYS_ON) || si.child.l < X || si.child.r > X+W) {
	si.hneeded = 1;
	H -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_TOP) Y += si.scrollsize;
	// recheck vertical since we added a horizontal scrollbar
	if (!si.vneeded && (type() & VERTICAL)) {
	  if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	    si.vneeded = 1;
	    W -= si.scrollsize;
	    if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
	  }
	}
      }
    }
    si.innerchild.x = X;
    si.innerchild.y = Y;
    si.innerchild.w = W;
    si.innerchild.h = H;
  }

  // calculate hor scrollbar position
  si.hscroll.x = si.innerchild.x;
  si.hscroll.y = (scrollbar.align() & FL_ALIGN_TOP)
		     ? si.innerbox.y
		     : si.innerbox.y + si.innerbox.h - si.scrollsize;
  si.hscroll.w = si.innerchild.w;
  si.hscroll.h = si.scrollsize;

  // calculate ver scrollbar position
  si.vscroll.x = (scrollbar.align() & FL_ALIGN_LEFT)
                     ? si.innerbox.x
		     : si.innerbox.x + si.innerbox.w - si.scrollsize;
  si.vscroll.y = si.innerchild.y;
  si.vscroll.w = si.scrollsize;
  si.vscroll.h = si.innerchild.h;

  // calculate h/v scrollbar values (pos/size/first/total)
  si.hscroll.pos = si.innerchild.x - si.child.l;
  si.hscroll.size = si.innerchild.w;
  si.hscroll.first = 0;
  si.hscroll.total = si.child.r - si.child.l;
  if ( si.hscroll.pos < 0 ) { si.hscroll.total += (-si.hscroll.pos); si.hscroll.first = si.hscroll.pos; }

  si.vscroll.pos = si.innerchild.y - si.child.t;
  si.vscroll.size = si.innerchild.h;
  si.vscroll.first = 0;
  si.vscroll.total = si.child.b - si.child.t;
  if ( si.vscroll.pos < 0 ) { si.vscroll.total += (-si.vscroll.pos); si.vscroll.first = si.vscroll.pos; }

//  printf("DEBUG --- ScrollInfo ---\n");
//  printf("DEBUG        scrollsize: %d\n", si.scrollsize);
//  printf("DEBUG  hneeded, vneeded: %d %d\n", si.hneeded, si.vneeded);
//  printf("DEBUG     innerbox.x, si.innerbox.y, si.innerbox.w,si.innerbox.h);
//  printf("DEBUG   innerchild.xywh: %d %d %d %d\n", si.innerchild.x, si.innerchild.y, si.innerchild.w, si.innerchild.h);
//  printf("DEBUG        child lrbt: %d %d %d %d\n", si.child.l, si.child.r, si.child.b, si.child.t);
//  printf("DEBUG      hscroll xywh: %d %d %d %d\n", si.hscroll.x, si.hscroll.y, si.hscroll.w, si.hscroll.h);
//  printf("DEBUG      vscroll xywh: %d %d %d %d\n", si.vscroll.x, si.vscroll.y, si.vscroll.w, si.vscroll.h);
//  printf("DEBUG  horz scroll vals: %d %d %d %d\n", si.hscroll.pos, si.hscroll.size, si.hscroll.first, si.hscroll.total);
//  printf("DEBUG  vert scroll vals: %d %d %d %d\n", si.vscroll.pos, si.vscroll.size, si.vscroll.first, si.vscroll.total);
//  printf("DEBUG \n");
}